

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  ParseContext *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  LogMessage *pLVar4;
  undefined1 auVar5 [16];
  UnknownFieldLiteParserHelper *local_e0;
  ParseContext **local_d8;
  ParseContext *local_d0;
  ParseContext *ctx_local;
  char *ptr_local;
  UnknownFieldLiteParserHelper *pUStack_b8;
  uint32_t num_local;
  UnknownFieldLiteParserHelper *this_local;
  undefined1 local_a8 [16];
  LogMessageFatal local_98 [23];
  Voidify local_81;
  string *local_80;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_70;
  LogMessageFatal local_68 [23];
  Voidify local_51;
  string *local_50;
  string *absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint32_t local_34;
  ParseContext *local_30;
  ParseContext *local_28;
  ParseContext *local_20;
  ParseContext *local_18;
  UnknownFieldLiteParserHelper **local_10;
  
  local_d0 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local._4_4_ = num;
  pUStack_b8 = this;
  if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)(num * 8 + 3),this->unknown_);
  }
  this_00 = local_d0;
  local_34 = ptr_local._4_4_ * 8 + 3;
  local_d8 = &local_d0;
  local_28 = local_d0;
  local_30 = ctx_local;
  _old_group_depth = &local_e0;
  iVar2 = local_d0->depth_ + -1;
  local_d0->depth_ = iVar2;
  local_e0 = this;
  if (iVar2 < 0) {
    local_20 = (ParseContext *)0x0;
  }
  else {
    local_d0->group_depth_ = local_d0->group_depth_ + 1;
    absl_log_internal_check_op_result._4_4_ = local_d0->depth_;
    absl_log_internal_check_op_result._0_4_ = local_d0->group_depth_;
    local_18 = ctx_local;
    local_10 = _old_group_depth;
    local_30 = (ParseContext *)
               WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                         (this,(char *)ctx_local,local_d0);
    if (local_30 != (ParseContext *)0x0) {
      iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result._4_4_);
      iVar3 = absl::lts_20240722::log_internal::GetReferenceableValue(this_00->depth_);
      local_50 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                           (iVar2,iVar3,"old_depth == depth_");
      if (local_50 != (string *)0x0) {
        auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
        local_70 = auVar5._8_8_;
        absl_log_internal_check_op_result_1 = auVar5._0_8_;
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,0x45b,absl_log_internal_check_op_result_1,local_70);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_68);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_51,pLVar4);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_68);
      }
      iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue
                        ((int)absl_log_internal_check_op_result);
      iVar3 = absl::lts_20240722::log_internal::GetReferenceableValue(this_00->group_depth_);
      local_80 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                           (iVar2,iVar3,"old_group_depth == group_depth_");
      if (local_80 != (string *)0x0) {
        local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,0x45c,local_a8._0_8_,local_a8._8_8_);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_98);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_81,pLVar4);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_98);
      }
      local_80 = (string *)0x0;
    }
    this_00->group_depth_ = this_00->group_depth_ + -1;
    this_00->depth_ = this_00->depth_ + 1;
    bVar1 = EpsCopyInputStream::ConsumeEndGroup(&this_00->super_EpsCopyInputStream,local_34);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_20 = local_30;
    }
    else {
      local_20 = (ParseContext *)0x0;
    }
  }
  ctx_local = local_20;
  if (local_20 == (ParseContext *)0x0) {
    this_local = (UnknownFieldLiteParserHelper *)0x0;
  }
  else {
    if (this->unknown_ != (string *)0x0) {
      WriteVarint((ulong)(ptr_local._4_4_ * 8 + 4),this->unknown_);
    }
    this_local = (UnknownFieldLiteParserHelper *)ctx_local;
  }
  return (char *)this_local;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroupInlined(ptr, num * 8 + 3, [&](const char* ptr) {
      return WireFormatParser(*this, ptr, ctx);
    });
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }